

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsHasOwnProperty(JsValueRef object,JsPropertyIdRef propertyId,bool *hasOwnProperty)

{
  anon_class_24_3_c47b7019 fn;
  JsErrorCode JVar1;
  bool **in_stack_ffffffffffffffc0;
  bool *local_20;
  bool *hasOwnProperty_local;
  JsPropertyIdRef propertyId_local;
  JsValueRef object_local;
  
  fn.object = &local_20;
  fn.propertyId = &propertyId_local;
  fn.hasOwnProperty = in_stack_ffffffffffffffc0;
  local_20 = hasOwnProperty;
  hasOwnProperty_local = (bool *)propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<true,JsHasOwnProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsHasOwnProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId,
    _Out_ bool *hasOwnProperty)
{
    return ContextAPIWrapper<true>([&](Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTHasOwnProperty, (const Js::PropertyRecord *)propertyId, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(hasOwnProperty);
        *hasOwnProperty = false;

        return JsHasOwnPropertyCommon(scriptContext, object,
            (const Js::PropertyRecord *)propertyId, hasOwnProperty, nullptr);
    });
}